

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkPairDetector.cpp
# Opt level: O0

void __thiscall
btGjkPairDetector::getClosestPointsNonVirtual
          (btGjkPairDetector *this,ClosestPointInput *input,Result *output,btIDebugDraw *debugDraw)

{
  int iVar1;
  btScalar abVar2 [4];
  bool bVar3;
  btVector3 *pbVar4;
  btScalar *pbVar5;
  btVoronoiSimplexSolver *in_RCX;
  long *in_RDX;
  btTransform *in_RSI;
  long in_RDI;
  btScalar bVar6;
  btScalar distance2_1;
  btVector3 w_2;
  btVector3 qWorld_2;
  btVector3 pWorld_2;
  btVector3 qInB_2;
  btVector3 pInA_2;
  btVector3 seperatingAxisInB_2;
  btVector3 seperatingAxisInA_2;
  btScalar d0;
  btVector3 w_1;
  btVector3 qWorld_1;
  btVector3 pWorld_1;
  btVector3 qInB_1;
  btVector3 pInA_1;
  btVector3 seperatingAxisInB_1;
  btVector3 seperatingAxisInA_1;
  btScalar d1;
  btScalar distance2;
  btScalar lenSqr_1;
  btVector3 tmpNormalInB;
  bool isValid2;
  btVector3 tmpPointOnB;
  btVector3 tmpPointOnA;
  bool catchDegeneratePenetrationCase;
  btScalar s;
  btScalar rlen;
  btScalar lenSqr;
  bool check;
  btScalar previousSquaredDistance;
  btVector3 newCachedSeparatingAxis;
  btScalar f1;
  btScalar f0;
  btVector3 w;
  btVector3 qWorld;
  btVector3 pWorld;
  btVector3 qInB;
  btVector3 pInA;
  btVector3 seperatingAxisInB;
  btVector3 seperatingAxisInA;
  btScalar margin;
  btScalar delta;
  btScalar squaredDistance;
  bool checkPenetration;
  bool checkSimplex;
  bool isValid;
  int gGjkMaxIter;
  btScalar marginB;
  btScalar marginA;
  bool check2d;
  btVector3 positionOffset;
  btTransform localTransB;
  btTransform localTransA;
  btVector3 pointOnB;
  btVector3 pointOnA;
  btVector3 normalInB;
  btScalar distance;
  btTransform *in_stack_fffffffffffffba8;
  btTransform *in_stack_fffffffffffffbb0;
  btMatrix3x3 *in_stack_fffffffffffffbb8;
  btVoronoiSimplexSolver *in_stack_fffffffffffffbc0;
  btVoronoiSimplexSolver *in_stack_fffffffffffffbc8;
  btVoronoiSimplexSolver *in_stack_fffffffffffffbd0;
  btVector3 *in_stack_fffffffffffffbd8;
  btVector3 *x;
  btTransform *in_stack_fffffffffffffbe0;
  btTransform *this_00;
  bool local_409;
  bool local_3d1;
  btScalar local_3d0 [4];
  btVector3 local_3c0;
  btVector3 local_3b0;
  btScalar local_3a0 [4];
  float local_390;
  btScalar local_38c;
  btVector3 local_388;
  btScalar local_378 [4];
  btScalar local_368 [4];
  btScalar local_358 [4];
  btScalar local_348 [4];
  btScalar local_338 [4];
  btScalar local_328 [4];
  btScalar local_318 [4];
  btScalar local_308;
  btVector3 local_304;
  btVector3 local_2f4;
  btScalar local_2e4 [4];
  btScalar local_2d4 [4];
  btScalar local_2c4 [4];
  btScalar local_2b4 [4];
  btScalar local_2a4 [4];
  btScalar local_294 [4];
  btScalar local_284 [4];
  btScalar local_274;
  btScalar local_270 [4];
  float local_260;
  btScalar local_25c;
  btScalar local_258;
  btScalar local_254 [4];
  byte local_241;
  undefined1 local_240 [36];
  float local_21c;
  btVector3 local_218;
  float local_208;
  btVector3 local_204;
  btScalar local_1f4;
  float local_1f0;
  btScalar local_1ec;
  byte local_1e5;
  btScalar local_1e4;
  btVector3 local_1e0;
  float local_1d0;
  float local_1cc;
  btVector3 local_1c8;
  btVector3 local_1b8;
  btVector3 local_1a8;
  btScalar local_198 [4];
  btScalar local_188 [4];
  btScalar local_178 [4];
  btScalar local_168 [4];
  btScalar local_158 [4];
  float local_148;
  btScalar local_144;
  btScalar local_140;
  byte local_13b;
  byte local_13a;
  byte local_139;
  btScalar local_138;
  btScalar local_134;
  btScalar local_130;
  int local_12c;
  float local_128;
  float local_124;
  bool local_11d;
  undefined4 local_11c;
  btScalar local_118 [4];
  btVector3 local_108;
  undefined1 local_f8 [16];
  btVector3 *in_stack_ffffffffffffff18;
  btConvexShape *in_stack_ffffffffffffff20;
  btTransform local_b8;
  btVector3 local_78;
  btVector3 local_68;
  btScalar local_54;
  btScalar local_50;
  btScalar local_4c;
  btVector3 local_48;
  float local_34;
  btVoronoiSimplexSolver *local_30;
  long *local_28;
  btTransform *local_20;
  
  *(undefined4 *)(in_RDI + 0x4c) = 0;
  local_34 = 0.0;
  local_4c = 0.0;
  local_50 = 0.0;
  local_54 = 0.0;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  btVector3::btVector3(&local_48,&local_4c,&local_50,&local_54);
  btVector3::btVector3(&local_68);
  btVector3::btVector3(&local_78);
  btTransform::btTransform(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  btTransform::btTransform(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  btTransform::getOrigin(&local_b8);
  btTransform::getOrigin((btTransform *)local_f8);
  local_118 = (btScalar  [4])
              operator+((btVector3 *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8->m_el);
  local_11c = 0x3f000000;
  local_108 = ::operator*((btVector3 *)in_stack_fffffffffffffbc0,
                          (btScalar *)in_stack_fffffffffffffbb8);
  pbVar4 = btTransform::getOrigin(&local_b8);
  btVector3::operator-=(pbVar4,&local_108);
  pbVar4 = btTransform::getOrigin((btTransform *)local_f8);
  btVector3::operator-=(pbVar4,&local_108);
  bVar3 = btCollisionShape::isConvex2d((btCollisionShape *)0x1e9b53);
  local_3d1 = false;
  if (bVar3) {
    local_3d1 = btCollisionShape::isConvex2d((btCollisionShape *)0x1e9b73);
  }
  local_11d = local_3d1;
  local_124 = *(float *)(in_RDI + 0x40);
  local_128 = *(float *)(in_RDI + 0x44);
  gNumGjkChecks = gNumGjkChecks + 1;
  if ((*(byte *)(in_RDI + 0x48) & 1) != 0) {
    local_124 = 0.0;
    local_128 = 0.0;
  }
  *(undefined4 *)(in_RDI + 0x54) = 0;
  local_12c = 1000;
  local_130 = 0.0;
  local_134 = 1.0;
  local_138 = 0.0;
  btVector3::setValue((btVector3 *)(in_RDI + 8),&local_130,&local_134,&local_138);
  local_139 = 0;
  local_13a = 0;
  local_13b = 1;
  *(undefined4 *)(in_RDI + 0x58) = 0;
  *(undefined4 *)(in_RDI + 0x50) = 0xffffffff;
  local_140 = 1e+18;
  local_144 = 0.0;
  local_148 = local_124 + local_128;
  btVoronoiSimplexSolver::reset(in_stack_fffffffffffffbd0);
  while( true ) {
    local_168 = (btScalar  [4])operator-((btVector3 *)in_stack_fffffffffffffbb0);
    btTransform::getBasis(local_20);
    local_158 = (btScalar  [4])
                ::operator*((btVector3 *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    btTransform::getBasis(local_20 + 1);
    local_178 = (btScalar  [4])
                ::operator*((btVector3 *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    local_188 = (btScalar  [4])
                btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                          (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    local_198 = (btScalar  [4])
                btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                          (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    local_1a8 = btTransform::operator()(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    local_1b8 = btTransform::operator()(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    if ((local_11d & 1U) != 0) {
      pbVar5 = btVector3::operator_cast_to_float_(&local_1a8);
      pbVar5[2] = 0.0;
      pbVar5 = btVector3::operator_cast_to_float_(&local_1b8);
      pbVar5[2] = 0.0;
    }
    local_1c8 = operator-((btVector3 *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8->m_el);
    local_144 = btVector3::dot((btVector3 *)(in_RDI + 8),&local_1c8);
    if ((0.0 < local_144) &&
       (local_140 * local_20[2].m_basis.m_el[0].m_floats[0] < local_144 * local_144)) {
      *(undefined4 *)(in_RDI + 0x58) = 10;
      local_13a = 1;
      goto LAB_001ea0d4;
    }
    bVar3 = btVoronoiSimplexSolver::inSimplex
                      (in_stack_fffffffffffffbc8,(btVector3 *)in_stack_fffffffffffffbc0);
    if (bVar3) {
      *(undefined4 *)(in_RDI + 0x58) = 1;
      local_13a = 1;
      goto LAB_001ea0d4;
    }
    local_1cc = local_140 - local_144;
    local_1d0 = local_140 * 1e-06;
    if (local_1cc <= local_1d0) break;
    btVoronoiSimplexSolver::addVertex
              (*(btVoronoiSimplexSolver **)(in_RDI + 0x20),&local_1c8,&local_1a8,&local_1b8);
    btVector3::btVector3(&local_1e0);
    bVar3 = btVoronoiSimplexSolver::closest
                      (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8->m_el);
    if (!bVar3) {
      *(undefined4 *)(in_RDI + 0x58) = 3;
      local_13a = 1;
      goto LAB_001ea0d4;
    }
    bVar6 = btVector3::length2((btVector3 *)0x1e9fc4);
    if (bVar6 < 1e-06) {
      *(undefined8 *)(in_RDI + 8) = local_1e0.m_floats._0_8_;
      *(undefined8 *)(in_RDI + 0x10) = local_1e0.m_floats._8_8_;
      *(undefined4 *)(in_RDI + 0x58) = 6;
      local_13a = 1;
      goto LAB_001ea0d4;
    }
    local_1e4 = local_140;
    local_140 = btVector3::length2((btVector3 *)0x1ea024);
    if (local_1e4 - local_140 <= local_1e4 * 1.1920929e-07) {
      local_13a = 1;
      *(undefined4 *)(in_RDI + 0x58) = 0xc;
      goto LAB_001ea0d4;
    }
    *(undefined8 *)(in_RDI + 8) = local_1e0.m_floats._0_8_;
    *(undefined8 *)(in_RDI + 0x10) = local_1e0.m_floats._8_8_;
    iVar1 = *(int *)(in_RDI + 0x54);
    *(int *)(in_RDI + 0x54) = iVar1 + 1;
    if (local_12c < iVar1) goto LAB_001ea0d4;
    bVar3 = btVoronoiSimplexSolver::fullSimplex(*(btVoronoiSimplexSolver **)(in_RDI + 0x20));
    local_1e5 = (bVar3 ^ 0xffU) & 1;
    if (local_1e5 == 0) {
      *(undefined4 *)(in_RDI + 0x58) = 0xd;
LAB_001ea0d4:
      if ((local_13a & 1) != 0) {
        btVoronoiSimplexSolver::compute_points
                  (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8->m_el,
                   (btVector3 *)in_stack_fffffffffffffbb0);
        local_48.m_floats._0_8_ = *(undefined8 *)(in_RDI + 8);
        local_48.m_floats._8_8_ = *(undefined8 *)(in_RDI + 0x10);
        local_1ec = btVector3::length2((btVector3 *)0x1ea126);
        if (local_1ec < 0.0001) {
          *(undefined4 *)(in_RDI + 0x58) = 5;
        }
        if (local_1ec <= 1.4210855e-14) {
          *(undefined4 *)(in_RDI + 0x50) = 2;
        }
        else {
          bVar6 = btSqrt(0.0);
          local_1f0 = 1.0 / bVar6;
          btVector3::operator*=(&local_48,&local_1f0);
          local_1f4 = btSqrt(0.0);
          local_208 = local_124 / local_1f4;
          local_204 = ::operator*((btVector3 *)in_stack_fffffffffffffbc0,
                                  (btScalar *)in_stack_fffffffffffffbb8);
          btVector3::operator-=(&local_68,&local_204);
          local_21c = local_128 / local_1f4;
          local_218 = ::operator*((btVector3 *)in_stack_fffffffffffffbc0,
                                  (btScalar *)in_stack_fffffffffffffbb8);
          btVector3::operator+=(&local_78,&local_218);
          local_34 = 1.0 / local_1f0 - local_148;
          local_139 = 1;
          *(undefined4 *)(in_RDI + 0x50) = 1;
        }
      }
      local_409 = false;
      if (((*(int *)(in_RDI + 0x5c) != 0) && (local_409 = false, *(long *)(in_RDI + 0x18) != 0)) &&
         (local_409 = false, *(int *)(in_RDI + 0x58) != 0)) {
        local_409 = local_34 + local_148 < 0.01;
      }
      local_240[0x23] = local_409;
      if ((((local_13b & 1) != 0) && (((local_139 & 1) == 0 || (local_409 != false)))) &&
         (*(long *)(in_RDI + 0x18) != 0)) {
        btVector3::btVector3((btVector3 *)(local_240 + 0x10));
        btVector3::btVector3((btVector3 *)local_240);
        gNumDeepPenetrationChecks = gNumDeepPenetrationChecks + 1;
        btVector3::setZero((btVector3 *)in_stack_fffffffffffffbb0);
        pbVar5 = (btScalar *)(in_RDI + 8);
        pbVar4 = (btVector3 *)(local_240 + 0x10);
        in_stack_fffffffffffffbb8 = (btMatrix3x3 *)local_240;
        local_241 = (**(code **)(**(long **)(in_RDI + 0x18) + 0x10))
                              (*(long **)(in_RDI + 0x18),*(undefined8 *)(in_RDI + 0x20),
                               *(undefined8 *)(in_RDI + 0x28),*(undefined8 *)(in_RDI + 0x30),
                               &local_b8,local_f8);
        local_241 = local_241 & 1;
        if (local_241 == 0) {
          bVar6 = btVector3::length2((btVector3 *)0x1ea900);
          in_stack_fffffffffffffbc0 = local_30;
          if (0.0 < bVar6) {
            local_3a0 = (btScalar  [4])
                        operator-((btVector3 *)local_30,in_stack_fffffffffffffbb8->m_el);
            bVar6 = btVector3::length((btVector3 *)0x1ea940);
            local_390 = bVar6 - local_148;
            if (((local_139 & 1) == 0) || (local_390 < local_34)) {
              local_68.m_floats[0] = (btScalar)local_240._16_4_;
              local_68.m_floats[1] = (btScalar)local_240._20_4_;
              local_68.m_floats[2] = (btScalar)local_240._24_4_;
              local_68.m_floats[3] = (btScalar)local_240._28_4_;
              local_78.m_floats[0] = (btScalar)local_240._0_4_;
              local_78.m_floats[1] = (btScalar)local_240._4_4_;
              local_78.m_floats[2] = (btScalar)local_240._8_4_;
              local_78.m_floats[3] = (btScalar)local_240._12_4_;
              local_34 = local_390;
              local_3b0 = ::operator*((btVector3 *)local_30,(btScalar *)in_stack_fffffffffffffbb8);
              btVector3::operator-=(&local_68,&local_3b0);
              local_3c0 = ::operator*((btVector3 *)local_30,(btScalar *)in_stack_fffffffffffffbb8);
              btVector3::operator+=(&local_78,&local_3c0);
              local_48.m_floats._0_8_ = *(undefined8 *)(in_RDI + 8);
              local_48.m_floats._8_8_ = *(undefined8 *)(in_RDI + 0x10);
              btVector3::normalize(pbVar4);
              local_139 = 1;
              *(undefined4 *)(in_RDI + 0x50) = 6;
              in_stack_fffffffffffffbc0 = local_30;
            }
            else {
              *(undefined4 *)(in_RDI + 0x50) = 5;
              in_stack_fffffffffffffbc0 = local_30;
            }
          }
        }
        else {
          local_254 = (btScalar  [4])
                      operator-((btVector3 *)local_30,in_stack_fffffffffffffbb8->m_el);
          local_258 = btVector3::length2((btVector3 *)0x1ea43c);
          in_stack_fffffffffffffbc0 = local_30;
          if (local_258 <= 1.4210855e-14) {
            local_254 = *(btScalar (*) [4])(in_RDI + 8);
            local_258 = btVector3::length2((btVector3 *)0x1ea47d);
            in_stack_fffffffffffffbc0 = local_30;
          }
          if (local_258 <= 1.4210855e-14) {
            *(undefined4 *)(in_RDI + 0x50) = 9;
          }
          else {
            local_25c = btSqrt(0.0);
            btVector3::operator/=(pbVar4,pbVar5);
            local_270 = (btScalar  [4])
                        operator-((btVector3 *)in_stack_fffffffffffffbc0,
                                  in_stack_fffffffffffffbb8->m_el);
            bVar6 = btVector3::length((btVector3 *)0x1ea500);
            abVar2 = local_254;
            local_260 = -bVar6;
            *(undefined4 *)(in_RDI + 0x50) = 3;
            if (((local_139 & 1) == 0) || (local_260 < local_34)) {
              local_68.m_floats[0] = (btScalar)local_240._16_4_;
              local_68.m_floats[1] = (btScalar)local_240._20_4_;
              local_68.m_floats[2] = (btScalar)local_240._24_4_;
              local_68.m_floats[3] = (btScalar)local_240._28_4_;
              local_78.m_floats[0] = (btScalar)local_240._0_4_;
              local_78.m_floats[1] = (btScalar)local_240._4_4_;
              local_78.m_floats[2] = (btScalar)local_240._8_4_;
              local_78.m_floats[3] = (btScalar)local_240._12_4_;
              local_48.m_floats[0] = local_254[0];
              local_48.m_floats[1] = local_254[1];
              local_48.m_floats[2] = local_254[2];
              local_48.m_floats[3] = local_254[3];
              local_274 = 0.0;
              local_254 = abVar2;
              local_34 = local_260;
              btTransform::getBasis(local_20);
              x = &local_48;
              local_284 = (btScalar  [4])
                          ::operator*((btVector3 *)in_stack_fffffffffffffbc0,
                                      in_stack_fffffffffffffbb8);
              local_2a4 = (btScalar  [4])operator-(pbVar4);
              btTransform::getBasis(local_20 + 1);
              local_294 = (btScalar  [4])
                          ::operator*((btVector3 *)in_stack_fffffffffffffbc0,
                                      in_stack_fffffffffffffbb8);
              local_2b4 = (btScalar  [4])
                          btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
              local_2c4 = (btScalar  [4])
                          btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
              this_00 = &local_b8;
              local_2d4 = (btScalar  [4])btTransform::operator()(this_00,x);
              local_2e4 = (btScalar  [4])btTransform::operator()(this_00,x);
              local_2f4 = operator-((btVector3 *)in_stack_fffffffffffffbc0,
                                    in_stack_fffffffffffffbb8->m_el);
              local_304 = operator-(pbVar4);
              local_274 = btVector3::dot(&local_304,&local_2f4);
              local_308 = 0.0;
              local_328 = (btScalar  [4])operator-(pbVar4);
              btTransform::getBasis(local_20);
              local_318 = (btScalar  [4])
                          ::operator*((btVector3 *)in_stack_fffffffffffffbc0,
                                      in_stack_fffffffffffffbb8);
              btTransform::getBasis(local_20 + 1);
              local_338 = (btScalar  [4])
                          ::operator*((btVector3 *)in_stack_fffffffffffffbc0,
                                      in_stack_fffffffffffffbb8);
              local_348 = (btScalar  [4])
                          btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
              local_358 = (btScalar  [4])
                          btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
              local_368 = (btScalar  [4])btTransform::operator()(this_00,x);
              local_378 = (btScalar  [4])btTransform::operator()(this_00,x);
              local_388 = operator-((btVector3 *)in_stack_fffffffffffffbc0,
                                    in_stack_fffffffffffffbb8->m_el);
              local_308 = btVector3::dot(&local_48,&local_388);
              if (local_308 < local_274) {
                *(undefined4 *)(in_RDI + 0x50) = 10;
                local_38c = -1.0;
                btVector3::operator*=(&local_48,&local_38c);
              }
              local_139 = 1;
            }
            else {
              *(undefined4 *)(in_RDI + 0x50) = 8;
            }
          }
        }
      }
      if (((local_139 & 1) != 0) &&
         ((local_34 < 0.0 || (local_34 * local_34 < local_20[2].m_basis.m_el[0].m_floats[0])))) {
        *(undefined8 *)(in_RDI + 8) = local_48.m_floats._0_8_;
        *(undefined8 *)(in_RDI + 0x10) = local_48.m_floats._8_8_;
        *(float *)(in_RDI + 0x4c) = local_34;
        local_3d0 = (btScalar  [4])
                    operator+((btVector3 *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8->m_el
                             );
        (**(code **)(*local_28 + 0x20))(local_28,&local_48,local_3d0);
      }
      return;
    }
  }
  if (0.0 < local_1cc) {
    *(undefined4 *)(in_RDI + 0x58) = 0xb;
  }
  else {
    *(undefined4 *)(in_RDI + 0x58) = 2;
  }
  local_13a = 1;
  goto LAB_001ea0d4;
}

Assistant:

void btGjkPairDetector::getClosestPointsNonVirtual(const ClosestPointInput& input, Result& output, class btIDebugDraw* debugDraw)
#endif
{
	m_cachedSeparatingDistance = 0.f;

	btScalar distance=btScalar(0.);
	btVector3	normalInB(btScalar(0.),btScalar(0.),btScalar(0.));

	btVector3 pointOnA,pointOnB;
	btTransform	localTransA = input.m_transformA;
	btTransform localTransB = input.m_transformB;
	btVector3 positionOffset=(localTransA.getOrigin() + localTransB.getOrigin()) * btScalar(0.5);
	localTransA.getOrigin() -= positionOffset;
	localTransB.getOrigin() -= positionOffset;

	bool check2d = m_minkowskiA->isConvex2d() && m_minkowskiB->isConvex2d();

	btScalar marginA = m_marginA;
	btScalar marginB = m_marginB;

	gNumGjkChecks++;

	//for CCD we don't use margins
	if (m_ignoreMargin)
	{
		marginA = btScalar(0.);
		marginB = btScalar(0.);
	}

	m_curIter = 0;
	int gGjkMaxIter = 1000;//this is to catch invalid input, perhaps check for #NaN?
	m_cachedSeparatingAxis.setValue(0,1,0);

	bool isValid = false;
	bool checkSimplex = false;
	bool checkPenetration = true;
	m_degenerateSimplex = 0;

	m_lastUsedMethod = -1;

	{
		btScalar squaredDistance = BT_LARGE_FLOAT;
		btScalar delta = btScalar(0.);
		
		btScalar margin = marginA + marginB;
		
		

		m_simplexSolver->reset();
		
		for ( ; ; )
		//while (true)
		{

			btVector3 seperatingAxisInA = (-m_cachedSeparatingAxis)* input.m_transformA.getBasis();
			btVector3 seperatingAxisInB = m_cachedSeparatingAxis* input.m_transformB.getBasis();


			btVector3 pInA = m_minkowskiA->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInA);
			btVector3 qInB = m_minkowskiB->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInB);

			btVector3  pWorld = localTransA(pInA);	
			btVector3  qWorld = localTransB(qInB);


			if (check2d)
			{
				pWorld[2] = 0.f;
				qWorld[2] = 0.f;
			}

			btVector3 w	= pWorld - qWorld;
			delta = m_cachedSeparatingAxis.dot(w);

			// potential exit, they don't overlap
			if ((delta > btScalar(0.0)) && (delta * delta > squaredDistance * input.m_maximumDistanceSquared)) 
			{
				m_degenerateSimplex = 10;
				checkSimplex=true;
				//checkPenetration = false;
				break;
			}

			//exit 0: the new point is already in the simplex, or we didn't come any closer
			if (m_simplexSolver->inSimplex(w))
			{
				m_degenerateSimplex = 1;
				checkSimplex = true;
				break;
			}
			// are we getting any closer ?
			btScalar f0 = squaredDistance - delta;
			btScalar f1 = squaredDistance * REL_ERROR2;

			if (f0 <= f1)
			{
				if (f0 <= btScalar(0.))
				{
					m_degenerateSimplex = 2;
				} else
				{
					m_degenerateSimplex = 11;
				}
				checkSimplex = true;
				break;
			}

			//add current vertex to simplex
			m_simplexSolver->addVertex(w, pWorld, qWorld);
			btVector3 newCachedSeparatingAxis;

			//calculate the closest point to the origin (update vector v)
			if (!m_simplexSolver->closest(newCachedSeparatingAxis))
			{
				m_degenerateSimplex = 3;
				checkSimplex = true;
				break;
			}

			if(newCachedSeparatingAxis.length2()<REL_ERROR2)
            {
				m_cachedSeparatingAxis = newCachedSeparatingAxis;
                m_degenerateSimplex = 6;
                checkSimplex = true;
                break;
            }

			btScalar previousSquaredDistance = squaredDistance;
			squaredDistance = newCachedSeparatingAxis.length2();
#if 0
///warning: this termination condition leads to some problems in 2d test case see Bullet/Demos/Box2dDemo
			if (squaredDistance>previousSquaredDistance)
			{
				m_degenerateSimplex = 7;
				squaredDistance = previousSquaredDistance;
                checkSimplex = false;
                break;
			}
#endif //
			

			//redundant m_simplexSolver->compute_points(pointOnA, pointOnB);

			//are we getting any closer ?
			if (previousSquaredDistance - squaredDistance <= SIMD_EPSILON * previousSquaredDistance) 
			{ 
//				m_simplexSolver->backup_closest(m_cachedSeparatingAxis);
				checkSimplex = true;
				m_degenerateSimplex = 12;
				
				break;
			}

			m_cachedSeparatingAxis = newCachedSeparatingAxis;

			  //degeneracy, this is typically due to invalid/uninitialized worldtransforms for a btCollisionObject   
              if (m_curIter++ > gGjkMaxIter)   
              {   
                      #if defined(DEBUG) || defined (_DEBUG)

                              printf("btGjkPairDetector maxIter exceeded:%i\n",m_curIter);   
                              printf("sepAxis=(%f,%f,%f), squaredDistance = %f, shapeTypeA=%i,shapeTypeB=%i\n",   
                              m_cachedSeparatingAxis.getX(),   
                              m_cachedSeparatingAxis.getY(),   
                              m_cachedSeparatingAxis.getZ(),   
                              squaredDistance,   
                              m_minkowskiA->getShapeType(),   
                              m_minkowskiB->getShapeType());   

                      #endif   
                      break;   

              } 


			bool check = (!m_simplexSolver->fullSimplex());
			//bool check = (!m_simplexSolver->fullSimplex() && squaredDistance > SIMD_EPSILON * m_simplexSolver->maxVertex());

			if (!check)
			{
				//do we need this backup_closest here ?
//				m_simplexSolver->backup_closest(m_cachedSeparatingAxis);
				m_degenerateSimplex = 13;
				break;
			}
		}

		if (checkSimplex)
		{
			m_simplexSolver->compute_points(pointOnA, pointOnB);
			normalInB = m_cachedSeparatingAxis;

			btScalar lenSqr =m_cachedSeparatingAxis.length2();
			
			//valid normal
			if (lenSqr < 0.0001)
			{
				m_degenerateSimplex = 5;
			} 
			if (lenSqr > SIMD_EPSILON*SIMD_EPSILON)
			{
				btScalar rlen = btScalar(1.) / btSqrt(lenSqr );
				normalInB *= rlen; //normalize

				btScalar s = btSqrt(squaredDistance);
			
				btAssert(s > btScalar(0.0));
				pointOnA -= m_cachedSeparatingAxis * (marginA / s);
				pointOnB += m_cachedSeparatingAxis * (marginB / s);
				distance = ((btScalar(1.)/rlen) - margin);
				isValid = true;
				
				m_lastUsedMethod = 1;
			} else
			{
				m_lastUsedMethod = 2;
			}
		}

		bool catchDegeneratePenetrationCase = 
			(m_catchDegeneracies && m_penetrationDepthSolver && m_degenerateSimplex && ((distance+margin) < 0.01));

		//if (checkPenetration && !isValid)
		if (checkPenetration && (!isValid || catchDegeneratePenetrationCase ))
		{
			//penetration case

			//if there is no way to handle penetrations, bail out
			if (m_penetrationDepthSolver)
			{
				// Penetration depth case.
				btVector3 tmpPointOnA,tmpPointOnB;
				
				gNumDeepPenetrationChecks++;
				m_cachedSeparatingAxis.setZero();

				bool isValid2 = m_penetrationDepthSolver->calcPenDepth( 
					*m_simplexSolver, 
					m_minkowskiA,m_minkowskiB,
					localTransA,localTransB,
					m_cachedSeparatingAxis, tmpPointOnA, tmpPointOnB,
					debugDraw
					);


				if (isValid2)
				{
					btVector3 tmpNormalInB = tmpPointOnB-tmpPointOnA;
					btScalar lenSqr = tmpNormalInB.length2();
					if (lenSqr <= (SIMD_EPSILON*SIMD_EPSILON))
					{
						tmpNormalInB = m_cachedSeparatingAxis;
						lenSqr = m_cachedSeparatingAxis.length2();
					}

					if (lenSqr > (SIMD_EPSILON*SIMD_EPSILON))
					{
						tmpNormalInB /= btSqrt(lenSqr);
						btScalar distance2 = -(tmpPointOnA-tmpPointOnB).length();
						m_lastUsedMethod = 3;
						//only replace valid penetrations when the result is deeper (check)
						if (!isValid || (distance2 < distance))
						{
							distance = distance2;
							pointOnA = tmpPointOnA;
							pointOnB = tmpPointOnB;
							normalInB = tmpNormalInB;
							///todo: need to track down this EPA penetration solver degeneracy
							///the penetration solver reports penetration but the contact normal
							///connecting the contact points is pointing in the opposite direction
							///until then, detect the issue and revert the normal
							{
								btScalar d1=0;
								{
									btVector3 seperatingAxisInA = (normalInB)* input.m_transformA.getBasis();
									btVector3 seperatingAxisInB = -normalInB* input.m_transformB.getBasis();
								

									btVector3 pInA = m_minkowskiA->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInA);
									btVector3 qInB = m_minkowskiB->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInB);

									btVector3  pWorld = localTransA(pInA);	
									btVector3  qWorld = localTransB(qInB);
									btVector3 w	= pWorld - qWorld;
									d1 = (-normalInB).dot(w);
								}
								btScalar d0 = 0.f;
								{
									btVector3 seperatingAxisInA = (-normalInB)* input.m_transformA.getBasis();
									btVector3 seperatingAxisInB = normalInB* input.m_transformB.getBasis();
								

									btVector3 pInA = m_minkowskiA->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInA);
									btVector3 qInB = m_minkowskiB->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInB);

									btVector3  pWorld = localTransA(pInA);	
									btVector3  qWorld = localTransB(qInB);
									btVector3 w	= pWorld - qWorld;
									d0 = normalInB.dot(w);
								}
								if (d1>d0)
								{
									m_lastUsedMethod = 10;
									normalInB*=-1;
								} 

							}
							isValid = true;
							
						} else
						{
							m_lastUsedMethod = 8;
						}
					} else
					{
						m_lastUsedMethod = 9;
					}
				} else

				{
					///this is another degenerate case, where the initial GJK calculation reports a degenerate case
					///EPA reports no penetration, and the second GJK (using the supporting vector without margin)
					///reports a valid positive distance. Use the results of the second GJK instead of failing.
					///thanks to Jacob.Langford for the reproduction case
					///http://code.google.com/p/bullet/issues/detail?id=250

				
					if (m_cachedSeparatingAxis.length2() > btScalar(0.))
					{
						btScalar distance2 = (tmpPointOnA-tmpPointOnB).length()-margin;
						//only replace valid distances when the distance is less
						if (!isValid || (distance2 < distance))
						{
							distance = distance2;
							pointOnA = tmpPointOnA;
							pointOnB = tmpPointOnB;
							pointOnA -= m_cachedSeparatingAxis * marginA ;
							pointOnB += m_cachedSeparatingAxis * marginB ;
							normalInB = m_cachedSeparatingAxis;
							normalInB.normalize();

							isValid = true;
							m_lastUsedMethod = 6;
						} else
						{
							m_lastUsedMethod = 5;
						}
					}
				}
				
			}

		}
	}

	

	if (isValid && ((distance < 0) || (distance*distance < input.m_maximumDistanceSquared)))
	{

		m_cachedSeparatingAxis = normalInB;
		m_cachedSeparatingDistance = distance;

		output.addContactPoint(
			normalInB,
			pointOnB+positionOffset,
			distance);

	}


}